

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O2

EStatusCode __thiscall
UnicodeString::FromUTF16UShort(UnicodeString *this,unsigned_short *inShorts,unsigned_long inLength)

{
  ushort uVar1;
  ulong in_RAX;
  Trace *this_00;
  ulong uVar2;
  ulong local_38;
  
  local_38 = in_RAX;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  uVar2 = 0;
  do {
    if (inLength <= uVar2) {
      return eSuccess;
    }
    uVar1 = inShorts[uVar2];
    if ((uVar1 & 0xfc00) == 0xd800) {
      if ((inLength <= uVar2 + 1) || ((ushort)(inShorts[uVar2 + 1] + 0x2000) < 0xfc00)) {
        this_00 = Trace::DefaultTrace();
        Trace::TraceToLog(this_00,
                          "UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate"
                         );
        return eFailure;
      }
      local_38 = (ulong)((uint)uVar1 * 0x400 + (uint)inShorts[uVar2 + 1] + 0x202400 & 0x3fffff);
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->mUnicodeCharacters,&local_38);
      uVar2 = uVar2 + 1;
    }
    else {
      local_38 = (ulong)uVar1;
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->mUnicodeCharacters,&local_38);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

EStatusCode UnicodeString::FromUTF16UShort(const unsigned short* inShorts, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	for(unsigned long i = 0; i < inLength && PDFHummus::eSuccess == status; ++i)
	{
		if(0xD800 <= inShorts[i] && inShorts[i] <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			++i;
			if(i>=inLength)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			if(0xDC00 > inShorts[i] || inShorts[i] > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			mUnicodeCharacters.push_back(0x10000 + ((inShorts[i-1] - 0xD800) << 10) + (inShorts[i] - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(inShorts[i]);		
	}

	return status;		
}